

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colRope.c
# Opt level: O3

int Ucs2CopyDataProc(size_t index,size_t length,size_t number,Col_RopeChunk *chunks,
                    Col_ClientData clientData)

{
  Col_StringFormat CVar1;
  undefined2 *puVar2;
  uint uVar3;
  uint *puVar4;
  CopyDataInfo *info;
  uint *data;
  
  if (length != 0) {
    data = (uint *)chunks->data;
    do {
      CVar1 = chunks->format;
      if ((int)CVar1 < 4) {
        if (CVar1 == COL_UCS1) {
          uVar3 = (uint)(byte)*data;
        }
        else {
          if (CVar1 != COL_UCS2) goto LAB_0010a485;
          uVar3 = (uint)(ushort)*data;
        }
LAB_0010a494:
        puVar2 = *clientData;
        *puVar2 = (short)uVar3;
        *(undefined2 **)clientData = puVar2 + 1;
      }
      else {
        if (CVar1 == COL_UCS4) {
          uVar3 = *data;
        }
        else if (CVar1 == COL_UTF8) {
          uVar3 = Col_Utf8Get((Col_Char1 *)data);
        }
        else {
          if (CVar1 != COL_UTF16) goto LAB_0010a485;
          uVar3 = Col_Utf16Get((Col_Char2 *)data);
        }
        if (uVar3 < 0x10000) goto LAB_0010a494;
LAB_0010a485:
        uVar3 = *(uint *)((long)clientData + 8);
        if (uVar3 != 0xffffffff) goto LAB_0010a494;
      }
      CVar1 = chunks->format;
      if ((int)CVar1 < 4) {
        if (CVar1 == COL_UCS1) {
          puVar4 = (uint *)((long)data + 1);
        }
        else {
          puVar4 = (uint *)0x0;
          if (CVar1 == COL_UCS2) {
            puVar4 = (uint *)((long)data + 2);
          }
        }
      }
      else if (CVar1 == COL_UCS4) {
        puVar4 = data + 1;
      }
      else if (CVar1 == COL_UTF8) {
        puVar4 = (uint *)Col_Utf8Next((Col_Char1 *)data);
      }
      else {
        puVar4 = (uint *)0x0;
        if (CVar1 == COL_UTF16) {
          puVar4 = (uint *)Col_Utf16Next((Col_Char2 *)data);
        }
      }
      length = length - 1;
      data = puVar4;
    } while (length != 0);
  }
  return 0;
}

Assistant:

static int
Ucs2CopyDataProc(
    size_t index,                   /*!< Rope-relative index where chunks
                                         begin. */
    size_t length,                  /*!< Length of chunks. */
    size_t number,                  /*!< Number of chunks. Always 1. */
    const Col_RopeChunk *chunks,    /*!< Array of chunks. First chunk never
                                         NULL. */

    /*! [in,out] Points to #CopyDataInfo. */
    Col_ClientData clientData)
{
    CopyDataInfo *info = (CopyDataInfo *) clientData;
    const char *p = (const char *) chunks->data;
    Col_Char c;
    size_t i;

    ASSERT(number == 1);

    for (i = 0; i < length; i++, COL_CHAR_NEXT(chunks->format, p)) {
        c = COL_CHAR_GET(chunks->format, p);
        if (c > COL_CHAR2_MAX) {
            if (info->replace == COL_CHAR_INVALID) continue;
            c = info->replace;
        }
        *(Col_Char2 *) info->data = c;
        info->data += CHAR_WIDTH(COL_UCS2);
    }
    return 0;
}